

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.h
# Opt level: O1

void __thiscall
Minisat::StringOption::StringOption
          (StringOption *this,char *c,char *n,char *d,char *def,bool tunable,Option *dependOn)

{
  vec<Minisat::Option_*> *this_00;
  string *psVar1;
  size_t sVar2;
  StringOption *local_20;
  
  (this->super_Option)._vptr_Option = (_func_int **)&PTR__Option_00111c00;
  (this->super_Option).name = n;
  (this->super_Option).description = d;
  (this->super_Option).category = c;
  (this->super_Option).type_name = "<std::string>";
  (this->super_Option).dependOnNonDefaultOf = dependOn;
  this_00 = Option::getOptionList();
  local_20 = this;
  vec<Minisat::Option_*>::push(this_00,(Option **)&local_20);
  (this->super_Option)._vptr_Option = (_func_int **)&PTR__StringOption_00111cf8;
  if (def == (char *)0x0) {
    psVar1 = (string *)0x0;
  }
  else {
    psVar1 = (string *)operator_new(0x20);
    (psVar1->_M_dataplus)._M_p = (pointer)&psVar1->field_2;
    sVar2 = strlen(def);
    std::__cxx11::string::_M_construct<char_const*>((string *)psVar1,def,def + sVar2);
  }
  this->value = psVar1;
  this->defaultValue = def;
  return;
}

Assistant:

StringOption(const char *c, const char *n, const char *d, const char *def = NULL, bool tunable = false, Option *dependOn = 0)
      : Option(n, d, c, "<std::string>", tunable, dependOn), value(def == NULL ? NULL : new std::string(def)), defaultValue(def)
    {
    }